

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16781328,_true,_embree::avx512::VirtualCurveIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  vfloat<4> vVar1;
  BVH *bvh;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined8 uVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  byte bVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  char cVar38;
  byte bVar39;
  bool bVar40;
  int iVar41;
  AABBNodeMB4D *node1;
  undefined4 uVar42;
  uint uVar43;
  ulong uVar44;
  long lVar45;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar46;
  NodeRef root;
  size_t sVar47;
  byte bVar48;
  uint uVar49;
  NodeRef *pNVar50;
  byte bVar51;
  byte bVar52;
  ulong uVar53;
  ulong uVar54;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  vint4 bi_13;
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  vint4 ai_2;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  vint4 ai_1;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  vint4 ai_3;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 in_ZMM4 [64];
  vint4 bi;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  vint4 bi_1;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  float fVar96;
  float fVar97;
  vint4 bi_3;
  float fVar98;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  vint4 bi_2;
  vfloat4 a0;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  vint4 ai;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  TravRayK<4,_true> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  int iVar55;
  int iVar74;
  int iVar75;
  int iVar76;
  
  bvh = (BVH *)This->ptr;
  sVar47 = (bvh->root).ptr;
  if (sVar47 != 8) {
    auVar61 = *(undefined1 (*) [16])(ray + 0x80);
    auVar58 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
    auVar29 = ZEXT812(0) << 0x20;
    auVar59 = ZEXT816(0) << 0x40;
    uVar8 = vcmpps_avx512vl(auVar61,auVar59,5);
    uVar53 = vpcmpeqd_avx512vl(auVar58,(undefined1  [16])valid_i->field_0);
    uVar53 = ((byte)uVar8 & 0xf) & uVar53;
    bVar51 = (byte)uVar53;
    if (bVar51 != 0) {
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x60))->v;
      auVar56._0_4_ = tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_;
      auVar56._4_4_ = tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_;
      auVar56._8_4_ = tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_;
      auVar56._12_4_ = tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_;
      auVar57 = vfmadd231ps_fma(auVar56,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar57 = vfmadd231ps_fma(auVar57,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar56 = vrsqrt14ps_avx512vl(auVar57);
      auVar60._8_4_ = 0xbf000000;
      auVar60._0_8_ = 0xbf000000bf000000;
      auVar60._12_4_ = 0xbf000000;
      auVar57 = vmulps_avx512vl(auVar57,auVar60);
      fVar93 = auVar56._0_4_;
      fVar96 = auVar56._4_4_;
      fVar97 = auVar56._8_4_;
      fVar98 = auVar56._12_4_;
      auVar62._0_4_ = fVar93 * fVar93 * fVar93 * auVar57._0_4_;
      auVar62._4_4_ = fVar96 * fVar96 * fVar96 * auVar57._4_4_;
      auVar62._8_4_ = fVar97 * fVar97 * fVar97 * auVar57._8_4_;
      auVar62._12_4_ = fVar98 * fVar98 * fVar98 * auVar57._12_4_;
      auVar57._8_4_ = 0x3fc00000;
      auVar57._0_8_ = 0x3fc000003fc00000;
      auVar57._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vfmadd231ps_avx512vl(auVar62,auVar56,auVar57);
      auVar63._8_4_ = 0x80000000;
      auVar63._0_8_ = 0x8000000080000000;
      auVar63._12_4_ = 0x80000000;
      uVar44 = uVar53;
      do {
        lVar45 = 0;
        for (uVar54 = uVar44; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
          lVar45 = lVar45 + 1;
        }
        uVar54 = (ulong)(uint)((int)lVar45 * 4);
        auVar57 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar54 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar54 + 0x50)),0x1c);
        fVar93 = *(float *)((long)pre.ray_space + (uVar54 - 0x10));
        auVar57 = vinsertps_avx(auVar57,ZEXT416(*(uint *)(ray + uVar54 + 0x60)),0x28);
        auVar65._0_4_ = auVar57._0_4_ * fVar93;
        auVar65._4_4_ = auVar57._4_4_ * fVar93;
        auVar65._8_4_ = auVar57._8_4_ * fVar93;
        auVar65._12_4_ = auVar57._12_4_ * fVar93;
        auVar60 = vshufpd_avx(auVar65,auVar65,1);
        auVar57 = vmovshdup_avx(auVar65);
        auVar72._0_4_ = auVar57._0_4_ ^ 0x80000000;
        auVar62 = vunpckhps_avx(auVar65,auVar59);
        auVar67._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
        auVar67._8_8_ = auVar60._8_8_ ^ auVar63._8_8_;
        auVar56 = vinsertps_avx(auVar67,auVar65,0x2a);
        auVar57 = vdpps_avx(auVar56,auVar56,0x7f);
        auVar72._4_12_ = auVar29;
        auVar62 = vshufps_avx(auVar62,auVar72,0x41);
        auVar60 = vdpps_avx(auVar62,auVar62,0x7f);
        uVar8 = vcmpps_avx512vl(auVar57,auVar60,1);
        auVar57 = vpmovm2d_avx512vl(uVar8);
        auVar103._0_4_ = auVar57._0_4_;
        auVar103._4_4_ = auVar103._0_4_;
        auVar103._8_4_ = auVar103._0_4_;
        auVar103._12_4_ = auVar103._0_4_;
        uVar54 = vpmovd2m_avx512vl(auVar103);
        auVar64._4_4_ = (uint)((byte)(uVar54 >> 1) & 1) * auVar58._4_4_;
        auVar64._0_4_ = (uint)((byte)uVar54 & 1) * auVar58._0_4_;
        auVar64._8_4_ = (uint)((byte)(uVar54 >> 2) & 1) * auVar58._8_4_;
        auVar64._12_4_ = (uint)((byte)(uVar54 >> 3) & 1) * auVar58._12_4_;
        auVar57 = vblendvps_avx(auVar56,auVar62,auVar64);
        auVar60 = vdpps_avx(auVar57,auVar57,0x7f);
        auVar104._4_12_ = auVar29;
        auVar104._0_4_ = auVar60._0_4_;
        auVar56 = vrsqrt14ss_avx512f(auVar59,auVar104);
        fVar96 = auVar56._0_4_;
        fVar96 = fVar96 * 1.5 - auVar60._0_4_ * 0.5 * fVar96 * fVar96 * fVar96;
        auVar71._0_4_ = auVar57._0_4_ * fVar96;
        auVar71._4_4_ = auVar57._4_4_ * fVar96;
        auVar71._8_4_ = auVar57._8_4_ * fVar96;
        auVar71._12_4_ = auVar57._12_4_ * fVar96;
        auVar57 = vshufps_avx(auVar71,auVar71,0xc9);
        auVar60 = vshufps_avx(auVar65,auVar65,0xc9);
        auVar105._0_4_ = auVar71._0_4_ * auVar60._0_4_;
        auVar105._4_4_ = auVar71._4_4_ * auVar60._4_4_;
        auVar105._8_4_ = auVar71._8_4_ * auVar60._8_4_;
        auVar105._12_4_ = auVar71._12_4_ * auVar60._12_4_;
        auVar57 = vfmsub231ps_fma(auVar105,auVar65,auVar57);
        auVar60 = vshufps_avx(auVar57,auVar57,0xc9);
        auVar57 = vdpps_avx(auVar60,auVar60,0x7f);
        uVar44 = uVar44 - 1 & uVar44;
        auVar106._4_12_ = auVar29;
        auVar106._0_4_ = auVar57._0_4_;
        auVar56 = vrsqrt14ss_avx512f(auVar59,auVar106);
        fVar96 = auVar56._0_4_;
        fVar96 = fVar96 * 1.5 - auVar57._0_4_ * 0.5 * fVar96 * fVar96 * fVar96;
        auVar73._0_4_ = fVar96 * auVar60._0_4_;
        auVar73._4_4_ = fVar96 * auVar60._4_4_;
        auVar73._8_4_ = fVar96 * auVar60._8_4_;
        auVar73._12_4_ = fVar96 * auVar60._12_4_;
        auVar66._0_4_ = fVar93 * auVar65._0_4_;
        auVar66._4_4_ = fVar93 * auVar65._4_4_;
        auVar66._8_4_ = fVar93 * auVar65._8_4_;
        auVar66._12_4_ = fVar93 * auVar65._12_4_;
        auVar56 = vunpcklps_avx(auVar71,auVar66);
        auVar57 = vunpckhps_avx(auVar71,auVar66);
        auVar62 = vunpcklps_avx(auVar73,auVar59);
        auVar60 = vunpckhps_avx(auVar73,auVar59);
        aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar57,auVar60);
        aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar56,auVar62);
        aVar5 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar56,auVar62);
        pre.ray_space[lVar45].vx.field_0 = aVar7;
        pre.ray_space[lVar45].vy.field_0 = aVar5;
        pre.ray_space[lVar45].vz.field_0 = aVar6;
      } while (uVar44 != 0);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar107 = ZEXT1664(auVar58);
      auVar59 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar58);
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar108 = ZEXT1664(auVar57);
      uVar44 = vcmpps_avx512vl(auVar59,auVar57,1);
      auVar59 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar109 = ZEXT1664(auVar59);
      auVar60 = vdivps_avx512vl(auVar59,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar56 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar58);
      uVar54 = vcmpps_avx512vl(auVar56,auVar57,1);
      auVar56 = vdivps_avx512vl(auVar59,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar58 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar58);
      uVar9 = vcmpps_avx512vl(auVar58,auVar57,1);
      auVar58 = vdivps_avx512vl(auVar59,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      bVar40 = (bool)((byte)uVar44 & 1);
      tray.rdir.field_0._0_4_ = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar60._0_4_;
      bVar40 = (bool)((byte)(uVar44 >> 1) & 1);
      tray.rdir.field_0._4_4_ = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar60._4_4_;
      bVar40 = (bool)((byte)(uVar44 >> 2) & 1);
      tray.rdir.field_0._8_4_ = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar60._8_4_;
      bVar40 = (bool)((byte)(uVar44 >> 3) & 1);
      tray.rdir.field_0._12_4_ = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar60._12_4_;
      bVar40 = (bool)((byte)uVar54 & 1);
      tray.rdir.field_0._16_4_ = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar56._0_4_;
      bVar40 = (bool)((byte)(uVar54 >> 1) & 1);
      tray.rdir.field_0._20_4_ = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar56._4_4_;
      bVar40 = (bool)((byte)(uVar54 >> 2) & 1);
      tray.rdir.field_0._24_4_ = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar56._8_4_;
      bVar40 = (bool)((byte)(uVar54 >> 3) & 1);
      tray.rdir.field_0._28_4_ = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar56._12_4_;
      bVar40 = (bool)((byte)uVar9 & 1);
      tray.rdir.field_0._32_4_ = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar58._0_4_;
      bVar40 = (bool)((byte)(uVar9 >> 1) & 1);
      tray.rdir.field_0._36_4_ = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar58._4_4_;
      bVar40 = (bool)((byte)(uVar9 >> 2) & 1);
      tray.rdir.field_0._40_4_ = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar58._8_4_;
      bVar40 = (bool)((byte)(uVar9 >> 3) & 1);
      tray.rdir.field_0._44_4_ = (uint)bVar40 * 0x5d5e0b6b | (uint)!bVar40 * auVar58._12_4_;
      auVar58 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
      auVar110 = ZEXT1664(auVar58);
      uVar44 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar58,1);
      auVar59 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar44 >> 1) & 1) * auVar59._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar44 & 1) * auVar59._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar44 >> 2) & 1) * auVar59._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar44 >> 3) & 1) * auVar59._12_4_;
      uVar44 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar58,5);
      auVar59 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar40 = (bool)((byte)uVar44 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar40 * auVar59._0_4_ | (uint)!bVar40 * 0x60;
      bVar40 = (bool)((byte)(uVar44 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar40 * auVar59._4_4_ | (uint)!bVar40 * 0x60;
      bVar40 = (bool)((byte)(uVar44 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar40 * auVar59._8_4_ | (uint)!bVar40 * 0x60;
      bVar40 = (bool)((byte)(uVar44 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar40 * auVar59._12_4_ | (uint)!bVar40 * 0x60;
      uVar44 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar58,5);
      auVar59 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar40 = (bool)((byte)uVar44 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar40 * auVar59._0_4_ | (uint)!bVar40 * 0xa0;
      bVar40 = (bool)((byte)(uVar44 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar40 * auVar59._4_4_ | (uint)!bVar40 * 0xa0;
      bVar40 = (bool)((byte)(uVar44 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar40 * auVar59._8_4_ | (uint)!bVar40 * 0xa0;
      bVar40 = (bool)((byte)(uVar44 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar40 * auVar59._12_4_ | (uint)!bVar40 * 0xa0;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar111 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar59 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar58);
      tray.tnear.field_0.i[0] =
           (uint)(bVar51 & 1) * auVar59._0_4_ |
           (uint)!(bool)(bVar51 & 1) * stack_near[0].field_0._0_4_;
      bVar40 = (bool)((byte)(uVar53 >> 1) & 1);
      tray.tnear.field_0.i[1] =
           (uint)bVar40 * auVar59._4_4_ | (uint)!bVar40 * stack_near[0].field_0._4_4_;
      bVar40 = (bool)((byte)(uVar53 >> 2) & 1);
      tray.tnear.field_0.i[2] =
           (uint)bVar40 * auVar59._8_4_ | (uint)!bVar40 * stack_near[0].field_0._8_4_;
      bVar40 = SUB81(uVar53 >> 3,0);
      tray.tnear.field_0.i[3] =
           (uint)bVar40 * auVar59._12_4_ | (uint)!bVar40 * stack_near[0].field_0._12_4_;
      auVar61 = vmaxps_avx512vl(auVar61,auVar58);
      tray.tfar.field_0.i[0] =
           (uint)(bVar51 & 1) * auVar61._0_4_ | (uint)!(bool)(bVar51 & 1) * -0x800000;
      bVar40 = (bool)((byte)(uVar53 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar40 * auVar61._4_4_ | (uint)!bVar40 * -0x800000;
      bVar40 = (bool)((byte)(uVar53 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar40 * auVar61._8_4_ | (uint)!bVar40 * -0x800000;
      bVar40 = SUB81(uVar53 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar40 * auVar61._12_4_ | (uint)!bVar40 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar49 = 3;
      }
      else {
        uVar49 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      bVar48 = (byte)((ushort)((short)uVar53 << 0xc) >> 0xc) ^ 0xf;
      pNVar50 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar46 = &stack_near[2].field_0;
      stack_node[1].ptr = sVar47;
      stack_near[1].field_0.i[0] = tray.tnear.field_0.v[0];
      stack_near[1].field_0.i[1] = tray.tnear.field_0.v[1];
      stack_near[1].field_0.i[2] = tray.tnear.field_0.v[2];
      stack_near[1].field_0.i[3] = tray.tnear.field_0.v[3];
      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar112 = ZEXT1664(auVar61);
      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar113 = ZEXT1664(auVar61);
LAB_0077367f:
      do {
        do {
          root.ptr = pNVar50[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00773d92;
          pNVar50 = pNVar50 + -1;
          vVar1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar46[-1].v;
          auVar78 = ZEXT1664((undefined1  [16])vVar1.field_0);
          paVar46 = paVar46 + -1;
          uVar53 = vcmpps_avx512vl((undefined1  [16])vVar1.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar53 == '\0');
        uVar42 = (undefined4)uVar53;
        if (uVar49 < (uint)POPCOUNT(uVar42)) {
LAB_007736bb:
          do {
            iVar41 = 4;
            auVar61 = auVar110._0_16_;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00773d92;
              uVar8 = vcmpps_avx512vl(auVar78._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar8 != '\0') {
                if ((bVar48 & 0xf) == 0xf) {
                  bVar39 = 0;
                }
                else {
                  uVar53 = (ulong)(bVar48 & 0xf ^ 0xf);
                  bVar52 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                  pvVar2 = This->leafIntersector;
                  bVar39 = 0;
                  do {
                    lVar45 = 0;
                    for (uVar44 = uVar53; (uVar44 & 1) == 0;
                        uVar44 = uVar44 >> 1 | 0x8000000000000000) {
                      lVar45 = lVar45 + 1;
                    }
                    cVar38 = (**(code **)((long)pvVar2 + (ulong)bVar52 * 0x40 + 0x18))
                                       (&pre,ray,lVar45,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    auVar61 = auVar110._0_16_;
                    bVar28 = (byte)(1 << ((uint)lVar45 & 0x1f));
                    if (cVar38 == '\0') {
                      bVar28 = 0;
                    }
                    bVar39 = bVar39 | bVar28;
                    uVar53 = uVar53 - 1 & uVar53;
                  } while (uVar53 != 0);
                }
                bVar48 = bVar48 | bVar39;
                if (bVar48 == 0xf) {
                  bVar48 = 0xf;
                  goto LAB_00773d92;
                }
                auVar58 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar40 = (bool)(bVar48 >> 1 & 1);
                bVar3 = (bool)(bVar48 >> 2 & 1);
                bVar4 = (bool)(bVar48 >> 3 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar40 * auVar58._4_4_ | (uint)!bVar40 * tray.tfar.field_0.i[1];
                tray.tfar.field_0.i[0] =
                     (uint)(bVar48 & 1) * auVar58._0_4_ |
                     (uint)!(bool)(bVar48 & 1) * tray.tfar.field_0.i[0];
                tray.tfar.field_0.i[2] =
                     (uint)bVar3 * auVar58._8_4_ | (uint)!bVar3 * tray.tfar.field_0.i[2];
                tray.tfar.field_0.i[3] =
                     (uint)bVar4 * auVar58._12_4_ | (uint)!bVar4 * tray.tfar.field_0.i[3];
                auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar107 = ZEXT1664(auVar58);
                auVar58 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar108 = ZEXT1664(auVar58);
                auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar109 = ZEXT1664(auVar58);
                auVar61 = vxorps_avx512vl(auVar61,auVar61);
                auVar110 = ZEXT1664(auVar61);
                auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar111 = ZEXT1664(auVar61);
                auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar112 = ZEXT1664(auVar61);
                auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar113 = ZEXT1664(auVar61);
              }
              goto LAB_0077367f;
            }
            uVar8 = vcmpps_avx512vl(auVar78._0_16_,(undefined1  [16])tray.tfar.field_0,9);
            uVar53 = root.ptr & 0xfffffffffffffff0;
            uVar43 = (uint)root.ptr & 7;
            lVar45 = -0x20;
            sVar47 = 8;
            auVar58 = auVar111._0_16_;
            do {
              root.ptr = *(size_t *)(uVar53 + 0x40 + lVar45 * 2);
              if (root.ptr == 8) {
                auVar78 = ZEXT1664(auVar58);
                root.ptr = sVar47;
                break;
              }
              if ((uVar43 == 6) || (uVar43 == 1)) {
                uVar42 = *(undefined4 *)(uVar53 + 0x120 + lVar45);
                auVar79._4_4_ = uVar42;
                auVar79._0_4_ = uVar42;
                auVar79._8_4_ = uVar42;
                auVar79._12_4_ = uVar42;
                auVar59 = *(undefined1 (*) [16])(ray + 0x70);
                uVar42 = *(undefined4 *)(uVar53 + 0x60 + lVar45);
                auVar12._4_4_ = uVar42;
                auVar12._0_4_ = uVar42;
                auVar12._8_4_ = uVar42;
                auVar12._12_4_ = uVar42;
                auVar57 = vfmadd213ps_avx512vl(auVar79,auVar59,auVar12);
                uVar42 = *(undefined4 *)(uVar53 + 0x160 + lVar45);
                auVar81._4_4_ = uVar42;
                auVar81._0_4_ = uVar42;
                auVar81._8_4_ = uVar42;
                auVar81._12_4_ = uVar42;
                uVar42 = *(undefined4 *)(uVar53 + 0xa0 + lVar45);
                auVar13._4_4_ = uVar42;
                auVar13._0_4_ = uVar42;
                auVar13._8_4_ = uVar42;
                auVar13._12_4_ = uVar42;
                auVar60 = vfmadd213ps_avx512vl(auVar81,auVar59,auVar13);
                uVar42 = *(undefined4 *)(uVar53 + 0x1a0 + lVar45);
                auVar84._4_4_ = uVar42;
                auVar84._0_4_ = uVar42;
                auVar84._8_4_ = uVar42;
                auVar84._12_4_ = uVar42;
                uVar42 = *(undefined4 *)(uVar53 + 0xe0 + lVar45);
                auVar14._4_4_ = uVar42;
                auVar14._0_4_ = uVar42;
                auVar14._8_4_ = uVar42;
                auVar14._12_4_ = uVar42;
                auVar56 = vfmadd213ps_avx512vl(auVar84,auVar59,auVar14);
                uVar42 = *(undefined4 *)(uVar53 + 0x140 + lVar45);
                auVar87._4_4_ = uVar42;
                auVar87._0_4_ = uVar42;
                auVar87._8_4_ = uVar42;
                auVar87._12_4_ = uVar42;
                uVar42 = *(undefined4 *)(uVar53 + 0x80 + lVar45);
                auVar15._4_4_ = uVar42;
                auVar15._0_4_ = uVar42;
                auVar15._8_4_ = uVar42;
                auVar15._12_4_ = uVar42;
                auVar62 = vfmadd213ps_avx512vl(auVar87,auVar59,auVar15);
                uVar42 = *(undefined4 *)(uVar53 + 0x180 + lVar45);
                auVar90._4_4_ = uVar42;
                auVar90._0_4_ = uVar42;
                auVar90._8_4_ = uVar42;
                auVar90._12_4_ = uVar42;
                uVar42 = *(undefined4 *)(uVar53 + 0xc0 + lVar45);
                auVar16._4_4_ = uVar42;
                auVar16._0_4_ = uVar42;
                auVar16._8_4_ = uVar42;
                auVar16._12_4_ = uVar42;
                auVar63 = vfmadd213ps_avx512vl(auVar90,auVar59,auVar16);
                uVar42 = *(undefined4 *)(uVar53 + 0x1c0 + lVar45);
                auVar94._4_4_ = uVar42;
                auVar94._0_4_ = uVar42;
                auVar94._8_4_ = uVar42;
                auVar94._12_4_ = uVar42;
                uVar42 = *(undefined4 *)(uVar53 + 0x100 + lVar45);
                auVar17._4_4_ = uVar42;
                auVar17._0_4_ = uVar42;
                auVar17._8_4_ = uVar42;
                auVar17._12_4_ = uVar42;
                auVar64 = vfmadd213ps_avx512vl(auVar94,auVar59,auVar17);
                auVar30._8_8_ = tray.org.field_0._8_8_;
                auVar30._0_8_ = tray.org.field_0._0_8_;
                auVar32._8_8_ = tray.org.field_0._24_8_;
                auVar32._0_8_ = tray.org.field_0._16_8_;
                auVar34._8_8_ = tray.org.field_0._40_8_;
                auVar34._0_8_ = tray.org.field_0._32_8_;
                auVar57 = vsubps_avx(auVar57,auVar30);
                auVar101._0_4_ = tray.rdir.field_0._0_4_ * auVar57._0_4_;
                auVar101._4_4_ = tray.rdir.field_0._4_4_ * auVar57._4_4_;
                auVar101._8_4_ = tray.rdir.field_0._8_4_ * auVar57._8_4_;
                auVar101._12_4_ = tray.rdir.field_0._12_4_ * auVar57._12_4_;
                auVar57 = vsubps_avx(auVar60,auVar32);
                auVar82._0_4_ = auVar57._0_4_ * (float)tray.rdir.field_0._16_4_;
                auVar82._4_4_ = auVar57._4_4_ * (float)tray.rdir.field_0._20_4_;
                auVar82._8_4_ = auVar57._8_4_ * (float)tray.rdir.field_0._24_4_;
                auVar82._12_4_ = auVar57._12_4_ * (float)tray.rdir.field_0._28_4_;
                auVar57 = vsubps_avx(auVar56,auVar34);
                auVar85._0_4_ = tray.rdir.field_0._32_4_ * auVar57._0_4_;
                auVar85._4_4_ = tray.rdir.field_0._36_4_ * auVar57._4_4_;
                auVar85._8_4_ = tray.rdir.field_0._40_4_ * auVar57._8_4_;
                auVar85._12_4_ = tray.rdir.field_0._44_4_ * auVar57._12_4_;
                auVar57 = vsubps_avx(auVar62,auVar30);
                auVar88._0_4_ = tray.rdir.field_0._0_4_ * auVar57._0_4_;
                auVar88._4_4_ = tray.rdir.field_0._4_4_ * auVar57._4_4_;
                auVar88._8_4_ = tray.rdir.field_0._8_4_ * auVar57._8_4_;
                auVar88._12_4_ = tray.rdir.field_0._12_4_ * auVar57._12_4_;
                auVar57 = vsubps_avx(auVar63,auVar32);
                auVar91._0_4_ = auVar57._0_4_ * (float)tray.rdir.field_0._16_4_;
                auVar91._4_4_ = auVar57._4_4_ * (float)tray.rdir.field_0._20_4_;
                auVar91._8_4_ = auVar57._8_4_ * (float)tray.rdir.field_0._24_4_;
                auVar91._12_4_ = auVar57._12_4_ * (float)tray.rdir.field_0._28_4_;
                auVar57 = vsubps_avx(auVar64,auVar34);
                auVar95._0_4_ = tray.rdir.field_0._32_4_ * auVar57._0_4_;
                auVar95._4_4_ = tray.rdir.field_0._36_4_ * auVar57._4_4_;
                auVar95._8_4_ = tray.rdir.field_0._40_4_ * auVar57._8_4_;
                auVar95._12_4_ = tray.rdir.field_0._44_4_ * auVar57._12_4_;
                auVar57 = vpminsd_avx(auVar101,auVar88);
                auVar60 = vpminsd_avx(auVar82,auVar91);
                auVar57 = vpmaxsd_avx(auVar57,auVar60);
                auVar60 = vpminsd_avx(auVar85,auVar95);
                auVar57 = vpmaxsd_avx(auVar57,auVar60);
                auVar56 = vmulps_avx512vl(auVar57,auVar112._0_16_);
                auVar57 = vpmaxsd_avx(auVar101,auVar88);
                auVar60 = vpmaxsd_avx(auVar82,auVar91);
                auVar60 = vpminsd_avx(auVar57,auVar60);
                auVar57 = vpmaxsd_avx(auVar85,auVar95);
                auVar57 = vpminsd_avx(auVar60,auVar57);
                auVar60 = vmulps_avx512vl(auVar57,auVar113._0_16_);
                auVar36._4_4_ = tray.tnear.field_0.i[1];
                auVar36._0_4_ = tray.tnear.field_0.i[0];
                auVar36._8_4_ = tray.tnear.field_0.i[2];
                auVar36._12_4_ = tray.tnear.field_0.i[3];
                auVar57 = vpmaxsd_avx(auVar56,auVar36);
                auVar60 = vpminsd_avx(auVar60,(undefined1  [16])tray.tfar.field_0);
                uVar10 = vcmpps_avx512vl(auVar57,auVar60,2);
                bVar52 = (byte)uVar10;
                if (uVar43 == 6) {
                  uVar42 = *(undefined4 *)(uVar53 + 0x200 + lVar45);
                  auVar18._4_4_ = uVar42;
                  auVar18._0_4_ = uVar42;
                  auVar18._8_4_ = uVar42;
                  auVar18._12_4_ = uVar42;
                  uVar10 = vcmpps_avx512vl(auVar59,auVar18,1);
                  uVar42 = *(undefined4 *)(uVar53 + 0x1e0 + lVar45);
                  auVar19._4_4_ = uVar42;
                  auVar19._0_4_ = uVar42;
                  auVar19._8_4_ = uVar42;
                  auVar19._12_4_ = uVar42;
                  uVar11 = vcmpps_avx512vl(auVar59,auVar19,0xd);
                  bVar52 = (byte)uVar10 & (byte)uVar11 & bVar52;
                }
              }
              else {
                uVar42 = *(undefined4 *)(uVar53 + 0x60 + lVar45);
                auVar92._4_4_ = uVar42;
                auVar92._0_4_ = uVar42;
                auVar92._8_4_ = uVar42;
                auVar92._12_4_ = uVar42;
                uVar42 = *(undefined4 *)(uVar53 + 0x80 + lVar45);
                auVar89._4_4_ = uVar42;
                auVar89._0_4_ = uVar42;
                auVar89._8_4_ = uVar42;
                auVar89._12_4_ = uVar42;
                uVar42 = *(undefined4 *)(uVar53 + 0xa0 + lVar45);
                auVar86._4_4_ = uVar42;
                auVar86._0_4_ = uVar42;
                auVar86._8_4_ = uVar42;
                auVar86._12_4_ = uVar42;
                uVar42 = *(undefined4 *)(uVar53 + 0xc0 + lVar45);
                auVar102._4_4_ = uVar42;
                auVar102._0_4_ = uVar42;
                auVar102._8_4_ = uVar42;
                auVar102._12_4_ = uVar42;
                uVar42 = *(undefined4 *)(uVar53 + 0xe0 + lVar45);
                auVar100._4_4_ = uVar42;
                auVar100._0_4_ = uVar42;
                auVar100._8_4_ = uVar42;
                auVar100._12_4_ = uVar42;
                uVar42 = *(undefined4 *)(uVar53 + 0x100 + lVar45);
                auVar99._4_4_ = uVar42;
                auVar99._0_4_ = uVar42;
                auVar99._8_4_ = uVar42;
                auVar99._12_4_ = uVar42;
                uVar42 = *(undefined4 *)(uVar53 + 0x120 + lVar45);
                auVar83._4_4_ = uVar42;
                auVar83._0_4_ = uVar42;
                auVar83._8_4_ = uVar42;
                auVar83._12_4_ = uVar42;
                uVar42 = *(undefined4 *)(uVar53 + 0x140 + lVar45);
                auVar80._4_4_ = uVar42;
                auVar80._0_4_ = uVar42;
                auVar80._8_4_ = uVar42;
                auVar80._12_4_ = uVar42;
                uVar42 = *(undefined4 *)(uVar53 + 0x160 + lVar45);
                auVar77._4_4_ = uVar42;
                auVar77._0_4_ = uVar42;
                auVar77._8_4_ = uVar42;
                auVar77._12_4_ = uVar42;
                auVar59 = *(undefined1 (*) [16])(ray + 0x70);
                auVar73 = auVar109._0_16_;
                auVar57 = vsubps_avx512vl(auVar73,auVar59);
                uVar42 = *(undefined4 *)(uVar53 + 0x1e0 + lVar45);
                auVar20._4_4_ = uVar42;
                auVar20._0_4_ = uVar42;
                auVar20._8_4_ = uVar42;
                auVar20._12_4_ = uVar42;
                auVar60 = vmulps_avx512vl(auVar59,auVar20);
                uVar42 = *(undefined4 *)(uVar53 + 0x200 + lVar45);
                auVar21._4_4_ = uVar42;
                auVar21._0_4_ = uVar42;
                auVar21._8_4_ = uVar42;
                auVar21._12_4_ = uVar42;
                auVar56 = vmulps_avx512vl(auVar59,auVar21);
                uVar42 = *(undefined4 *)(uVar53 + 0x220 + lVar45);
                auVar22._4_4_ = uVar42;
                auVar22._0_4_ = uVar42;
                auVar22._8_4_ = uVar42;
                auVar22._12_4_ = uVar42;
                auVar62 = vmulps_avx512vl(auVar59,auVar22);
                auVar60 = vfmadd231ps_avx512vl(auVar60,auVar57,auVar61);
                auVar56 = vfmadd231ps_avx512vl(auVar56,auVar57,auVar61);
                uVar42 = *(undefined4 *)(uVar53 + 0x240 + lVar45);
                auVar23._4_4_ = uVar42;
                auVar23._0_4_ = uVar42;
                auVar23._8_4_ = uVar42;
                auVar23._12_4_ = uVar42;
                auVar63 = vmulps_avx512vl(auVar59,auVar23);
                uVar42 = *(undefined4 *)(uVar53 + 0x260 + lVar45);
                auVar24._4_4_ = uVar42;
                auVar24._0_4_ = uVar42;
                auVar24._8_4_ = uVar42;
                auVar24._12_4_ = uVar42;
                auVar64 = vmulps_avx512vl(auVar59,auVar24);
                uVar42 = *(undefined4 *)(uVar53 + 0x280 + lVar45);
                auVar25._4_4_ = uVar42;
                auVar25._0_4_ = uVar42;
                auVar25._8_4_ = uVar42;
                auVar25._12_4_ = uVar42;
                auVar59 = vmulps_avx512vl(auVar59,auVar25);
                auVar62 = vfmadd231ps_avx512vl(auVar62,auVar57,auVar61);
                auVar63 = vaddps_avx512vl(auVar57,auVar63);
                auVar64 = vaddps_avx512vl(auVar57,auVar64);
                auVar57 = vaddps_avx512vl(auVar57,auVar59);
                auVar31._8_8_ = tray.org.field_0._8_8_;
                auVar31._0_8_ = tray.org.field_0._0_8_;
                auVar33._8_8_ = tray.org.field_0._24_8_;
                auVar33._0_8_ = tray.org.field_0._16_8_;
                auVar35._8_8_ = tray.org.field_0._40_8_;
                auVar35._0_8_ = tray.org.field_0._32_8_;
                auVar59 = vmulps_avx512vl(auVar83,(undefined1  [16])
                                                  tray.dir.field_0.field_0.z.field_0);
                auVar65 = vmulps_avx512vl(auVar80,(undefined1  [16])
                                                  tray.dir.field_0.field_0.z.field_0);
                auVar66 = vmulps_avx512vl(auVar77,(undefined1  [16])
                                                  tray.dir.field_0.field_0.z.field_0);
                auVar59 = vfmadd231ps_avx512vl
                                    (auVar59,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                     auVar102);
                auVar65 = vfmadd231ps_avx512vl
                                    (auVar65,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                     auVar100);
                auVar66 = vfmadd231ps_avx512vl
                                    (auVar66,auVar99,
                                     (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
                auVar59 = vfmadd231ps_avx512vl
                                    (auVar59,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                     auVar92);
                auVar65 = vfmadd231ps_avx512vl
                                    (auVar65,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                     auVar89);
                auVar66 = vfmadd231ps_avx512vl
                                    (auVar66,auVar86,
                                     (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
                auVar71 = auVar107._0_16_;
                auVar67 = vandps_avx512vl(auVar59,auVar71);
                auVar72 = auVar108._0_16_;
                uVar44 = vcmpps_avx512vl(auVar67,auVar72,1);
                bVar40 = (bool)((byte)uVar44 & 1);
                iVar55 = auVar108._0_4_;
                auVar68._0_4_ = (uint)bVar40 * iVar55 | (uint)!bVar40 * auVar59._0_4_;
                bVar40 = (bool)((byte)(uVar44 >> 1) & 1);
                iVar74 = auVar108._4_4_;
                auVar68._4_4_ = (uint)bVar40 * iVar74 | (uint)!bVar40 * auVar59._4_4_;
                bVar40 = (bool)((byte)(uVar44 >> 2) & 1);
                iVar75 = auVar108._8_4_;
                iVar76 = auVar108._12_4_;
                auVar68._8_4_ = (uint)bVar40 * iVar75 | (uint)!bVar40 * auVar59._8_4_;
                bVar40 = (bool)((byte)(uVar44 >> 3) & 1);
                auVar68._12_4_ = (uint)bVar40 * iVar76 | (uint)!bVar40 * auVar59._12_4_;
                auVar59 = vandps_avx512vl(auVar65,auVar71);
                uVar44 = vcmpps_avx512vl(auVar59,auVar72,1);
                bVar40 = (bool)((byte)uVar44 & 1);
                auVar69._0_4_ = (uint)bVar40 * iVar55 | (uint)!bVar40 * auVar65._0_4_;
                bVar40 = (bool)((byte)(uVar44 >> 1) & 1);
                auVar69._4_4_ = (uint)bVar40 * iVar74 | (uint)!bVar40 * auVar65._4_4_;
                bVar40 = (bool)((byte)(uVar44 >> 2) & 1);
                auVar69._8_4_ = (uint)bVar40 * iVar75 | (uint)!bVar40 * auVar65._8_4_;
                bVar40 = (bool)((byte)(uVar44 >> 3) & 1);
                auVar69._12_4_ = (uint)bVar40 * iVar76 | (uint)!bVar40 * auVar65._12_4_;
                auVar59 = vandps_avx512vl(auVar66,auVar71);
                uVar44 = vcmpps_avx512vl(auVar59,auVar72,1);
                bVar40 = (bool)((byte)uVar44 & 1);
                auVar70._0_4_ = (uint)bVar40 * iVar55 | (uint)!bVar40 * auVar66._0_4_;
                bVar40 = (bool)((byte)(uVar44 >> 1) & 1);
                auVar70._4_4_ = (uint)bVar40 * iVar74 | (uint)!bVar40 * auVar66._4_4_;
                bVar40 = (bool)((byte)(uVar44 >> 2) & 1);
                auVar70._8_4_ = (uint)bVar40 * iVar75 | (uint)!bVar40 * auVar66._8_4_;
                bVar40 = (bool)((byte)(uVar44 >> 3) & 1);
                auVar70._12_4_ = (uint)bVar40 * iVar76 | (uint)!bVar40 * auVar66._12_4_;
                auVar59 = vrcp14ps_avx512vl(auVar68);
                auVar65 = vfnmadd213ps_avx512vl(auVar68,auVar59,auVar73);
                auVar65 = vfmadd132ps_avx512vl(auVar65,auVar59,auVar59);
                auVar59 = vrcp14ps_avx512vl(auVar69);
                auVar66 = vfnmadd213ps_avx512vl(auVar69,auVar59,auVar73);
                auVar66 = vfmadd132ps_avx512vl(auVar66,auVar59,auVar59);
                auVar67 = vrcp14ps_avx512vl(auVar70);
                auVar71 = vfnmadd213ps_avx512vl(auVar70,auVar67,auVar73);
                uVar42 = *(undefined4 *)(uVar53 + 0x180 + lVar45);
                auVar59._4_4_ = uVar42;
                auVar59._0_4_ = uVar42;
                auVar59._8_4_ = uVar42;
                auVar59._12_4_ = uVar42;
                auVar59 = vfmadd213ps_avx512vl(auVar83,auVar35,auVar59);
                uVar42 = *(undefined4 *)(uVar53 + 0x1a0 + lVar45);
                auVar26._4_4_ = uVar42;
                auVar26._0_4_ = uVar42;
                auVar26._8_4_ = uVar42;
                auVar26._12_4_ = uVar42;
                auVar72 = vfmadd213ps_avx512vl(auVar80,auVar35,auVar26);
                uVar42 = *(undefined4 *)(uVar53 + 0x1c0 + lVar45);
                auVar27._4_4_ = uVar42;
                auVar27._0_4_ = uVar42;
                auVar27._8_4_ = uVar42;
                auVar27._12_4_ = uVar42;
                auVar73 = vfmadd213ps_avx512vl(auVar77,auVar35,auVar27);
                auVar67 = vfmadd132ps_avx512vl(auVar71,auVar67,auVar67);
                auVar59 = vfmadd231ps_avx512vl(auVar59,auVar33,auVar102);
                auVar71 = vfmadd231ps_avx512vl(auVar72,auVar33,auVar100);
                auVar72 = vfmadd231ps_avx512vl(auVar73,auVar33,auVar99);
                auVar73 = vfmadd231ps_avx512vl(auVar59,auVar31,auVar92);
                auVar71 = vfmadd231ps_avx512vl(auVar71,auVar31,auVar89);
                auVar72 = vfmadd231ps_avx512vl(auVar72,auVar31,auVar86);
                auVar59 = vsubps_avx(auVar60,auVar73);
                auVar60 = vmulps_avx512vl(auVar65,auVar59);
                auVar59 = vsubps_avx(auVar56,auVar71);
                auVar56 = vmulps_avx512vl(auVar66,auVar59);
                auVar59 = vsubps_avx(auVar62,auVar72);
                auVar62 = vmulps_avx512vl(auVar67,auVar59);
                auVar59 = vsubps_avx(auVar63,auVar73);
                auVar63 = vmulps_avx512vl(auVar65,auVar59);
                auVar59 = vsubps_avx(auVar64,auVar71);
                auVar64 = vmulps_avx512vl(auVar66,auVar59);
                auVar59 = vsubps_avx(auVar57,auVar72);
                auVar65 = vmulps_avx512vl(auVar67,auVar59);
                auVar59 = vpminsd_avx(auVar60,auVar63);
                auVar57 = vpminsd_avx(auVar56,auVar64);
                auVar59 = vpmaxsd_avx(auVar59,auVar57);
                auVar57 = vpminsd_avx(auVar62,auVar65);
                auVar59 = vpmaxsd_avx(auVar59,auVar57);
                auVar57 = vpmaxsd_avx(auVar60,auVar63);
                auVar60 = vpmaxsd_avx(auVar56,auVar64);
                auVar60 = vpminsd_avx(auVar57,auVar60);
                auVar57 = vpmaxsd_avx(auVar62,auVar65);
                auVar57 = vpminsd_avx(auVar60,auVar57);
                auVar56 = vmulps_avx512vl(auVar59,auVar112._0_16_);
                auVar59 = vmulps_avx512vl(auVar57,auVar113._0_16_);
                auVar37._4_4_ = tray.tnear.field_0.i[1];
                auVar37._0_4_ = tray.tnear.field_0.i[0];
                auVar37._8_4_ = tray.tnear.field_0.i[2];
                auVar37._12_4_ = tray.tnear.field_0.i[3];
                auVar57 = vpmaxsd_avx(auVar56,auVar37);
                auVar59 = vpminsd_avx(auVar59,(undefined1  [16])tray.tfar.field_0);
                uVar10 = vcmpps_avx512vl(auVar57,auVar59,2);
                bVar52 = (byte)uVar10;
              }
              bVar52 = bVar52 & (byte)uVar8;
              if (bVar52 == 0) {
                auVar78 = ZEXT1664(auVar58);
                root.ptr = sVar47;
              }
              else {
                auVar57 = vblendmps_avx512vl(auVar111._0_16_,auVar56);
                bVar40 = (bool)(bVar52 >> 1 & 1);
                bVar3 = (bool)(bVar52 >> 2 & 1);
                bVar4 = (bool)(bVar52 >> 3 & 1);
                auVar78 = ZEXT1664(CONCAT412((uint)bVar4 * auVar57._12_4_ |
                                             (uint)!bVar4 * auVar59._12_4_,
                                             CONCAT48((uint)bVar3 * auVar57._8_4_ |
                                                      (uint)!bVar3 * auVar59._8_4_,
                                                      CONCAT44((uint)bVar40 * auVar57._4_4_ |
                                                               (uint)!bVar40 * auVar59._4_4_,
                                                               (uint)(bVar52 & 1) * auVar57._0_4_ |
                                                               (uint)!(bool)(bVar52 & 1) *
                                                               auVar59._0_4_))));
                if (sVar47 != 8) {
                  pNVar50->ptr = sVar47;
                  pNVar50 = pNVar50 + 1;
                  *(undefined1 (*) [16])paVar46->v = auVar58;
                  paVar46 = paVar46 + 1;
                }
              }
              auVar58 = auVar78._0_16_;
              lVar45 = lVar45 + 4;
              sVar47 = root.ptr;
            } while (lVar45 != 0);
            if (root.ptr == 8) goto LAB_00773b41;
            uVar8 = vcmpps_avx512vl((undefined1  [16])auVar78._0_16_,
                                    (undefined1  [16])tray.tfar.field_0,9);
          } while ((byte)uVar49 < (byte)POPCOUNT((int)uVar8));
          pNVar50->ptr = root.ptr;
          pNVar50 = pNVar50 + 1;
          *paVar46 = auVar78._0_16_;
          paVar46 = paVar46 + 1;
        }
        else {
          do {
            sVar47 = 0;
            for (uVar44 = uVar53; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
              sVar47 = sVar47 + 1;
            }
            bVar40 = occluded1(This,bvh,root,sVar47,&pre,ray,&tray,context);
            bVar52 = (byte)(1 << ((uint)sVar47 & 0x1f));
            if (!bVar40) {
              bVar52 = 0;
            }
            bVar48 = bVar48 | bVar52;
            uVar53 = uVar53 - 1 & uVar53;
          } while (uVar53 != 0);
          iVar41 = 3;
          if (bVar48 != 0xf) {
            auVar61 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar40 = (bool)(bVar48 >> 1 & 1);
            bVar3 = (bool)(bVar48 >> 2 & 1);
            bVar4 = (bool)(bVar48 >> 3 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar40 * auVar61._4_4_ | (uint)!bVar40 * tray.tfar.field_0.i[1];
            tray.tfar.field_0.i[0] =
                 (uint)(bVar48 & 1) * auVar61._0_4_ |
                 (uint)!(bool)(bVar48 & 1) * tray.tfar.field_0.i[0];
            tray.tfar.field_0.i[2] =
                 (uint)bVar3 * auVar61._8_4_ | (uint)!bVar3 * tray.tfar.field_0.i[2];
            tray.tfar.field_0.i[3] =
                 (uint)bVar4 * auVar61._12_4_ | (uint)!bVar4 * tray.tfar.field_0.i[3];
            iVar41 = 2;
          }
          auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar107 = ZEXT1664(auVar61);
          auVar61 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar108 = ZEXT1664(auVar61);
          auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar109 = ZEXT1664(auVar61);
          auVar61 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
          auVar110 = ZEXT1664(auVar61);
          auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar111 = ZEXT1664(auVar61);
          auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar112 = ZEXT1664(auVar61);
          auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar113 = ZEXT1664(auVar61);
          auVar78 = ZEXT1664((undefined1  [16])vVar1.field_0);
          if (uVar49 < (uint)POPCOUNT(uVar42)) goto LAB_007736bb;
        }
LAB_00773b41:
      } while (iVar41 != 3);
LAB_00773d92:
      bVar48 = bVar48 & bVar51;
      bVar40 = (bool)(bVar48 >> 1 & 1);
      bVar3 = (bool)(bVar48 >> 2 & 1);
      *(uint *)(ray + 0x80) =
           (uint)(bVar48 & 1) * -0x800000 | (uint)!(bool)(bVar48 & 1) * *(int *)(ray + 0x80);
      *(uint *)(ray + 0x84) = (uint)bVar40 * -0x800000 | (uint)!bVar40 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar3 * -0x800000 | (uint)!bVar3 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar48 >> 3) * -0x800000 | (uint)!(bool)(bVar48 >> 3) * *(int *)(ray + 0x8c);
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }